

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantCollect_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vQuantCis,Vec_Int_t *vQuantSide,
               Vec_Int_t *vQuantAnds)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vQuantAnds_local;
  Vec_Int_t *vQuantSide_local;
  Vec_Int_t *vQuantCis_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    iVar1 = Gia_ManQuantCheckOverlap(p,iObj);
    if (iVar1 == 0) {
      Vec_IntPush(vQuantSide,iObj);
    }
    else {
      pObj_00 = Gia_ManObj(p,iObj);
      iVar1 = Gia_ObjIsCi(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
        Gia_ManQuantCollect_rec(p,iVar1,vQuantCis,vQuantSide,vQuantAnds);
        iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
        Gia_ManQuantCollect_rec(p,iVar1,vQuantCis,vQuantSide,vQuantAnds);
        Vec_IntPush(vQuantAnds,iObj);
      }
      else {
        Vec_IntPush(vQuantCis,iObj);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManQuantCollect_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vQuantCis, Vec_Int_t * vQuantSide, Vec_Int_t * vQuantAnds )
{
    Gia_Obj_t * pObj; 
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    if ( !Gia_ManQuantCheckOverlap(p, iObj) )
    {
        Vec_IntPush( vQuantSide, iObj );
        return;
    }
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vQuantCis, iObj );
        return;
    }
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId0(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId1(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntPush( vQuantAnds, iObj );
}